

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.hpp
# Opt level: O0

void MetaSim::attach_stat<Source::ProduceEvent,AvgQueueSizeStat>
               (AvgQueueSizeStat *s,ProduceEvent *e)

{
  unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_> p;
  unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
  *in_stack_ffffffffffffffa8;
  AvgQueueSizeStat *in_stack_ffffffffffffffb0;
  Event *this;
  ProduceEvent *in_stack_ffffffffffffffb8;
  Particle<Source::ProduceEvent,_AvgQueueSizeStat> *in_stack_ffffffffffffffc0;
  
  operator_new(0x18);
  Particle<Source::ProduceEvent,_AvgQueueSizeStat>::Particle
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  this = (Event *)&stack0xffffffffffffffe8;
  std::unique_ptr<MetaSim::ParticleInterface,std::default_delete<MetaSim::ParticleInterface>>::
  unique_ptr<std::default_delete<MetaSim::ParticleInterface>,void>
            ((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
              *)this,(pointer)in_stack_ffffffffffffffa8);
  std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>::
  unique_ptr((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
              *)this,in_stack_ffffffffffffffa8);
  Event::addParticle(this,in_stack_ffffffffffffffa8);
  std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>::
  ~unique_ptr((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
               *)this);
  std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>::
  ~unique_ptr((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
               *)this);
  return;
}

Assistant:

void attach_stat(StatClass &s, Evt &e) {
        std::unique_ptr< ParticleInterface > p(new Particle<Evt, StatClass>(e, s));
        e.addParticle(std::move(p));
    }